

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall Tigre::String::String(String *this,char *s)

{
  char *s_local;
  String *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::operator=((string *)this,s);
  return;
}

Assistant:

Tigre::String::String(const char s[]){
    this->value = s;
}